

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginMenu(char *label,bool enabled)

{
  ImGuiID IVar1;
  bool bVar2;
  bool bVar3;
  ImGuiPopupData *pIVar4;
  uint *puVar5;
  byte in_SIL;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImVec2 IVar10;
  ImRect IVar11;
  float extra;
  ImVec2 tc;
  ImVec2 tb;
  ImVec2 ta;
  ImRect next_window_rect;
  ImGuiWindow *child_menu_window;
  bool moving_toward_other_child_menu;
  bool want_close;
  bool want_open;
  bool hovered;
  ImU32 text_col;
  float extra_w;
  float min_w;
  float w;
  ImVec2 pos;
  ImVec2 popup_pos;
  ImGuiWindow *backed_nav_window;
  bool menuset_is_open;
  bool pressed;
  ImVec2 label_size;
  ImGuiWindowFlags flags;
  bool menu_is_open;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  float in_stack_fffffffffffffea0;
  float in_stack_fffffffffffffea4;
  ImRect *in_stack_fffffffffffffea8;
  ImGuiWindow *pIVar12;
  ImGuiCond cond;
  float in_stack_fffffffffffffeb0;
  uint uVar13;
  uint in_stack_fffffffffffffeb4;
  char *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  ImVec2 *in_stack_fffffffffffffec8;
  ImVec2 *this;
  ImGuiWindowFlags flags_00;
  ImGuiID in_stack_fffffffffffffed0;
  ImGuiStyleVar in_stack_fffffffffffffed4;
  ImVec2 local_f4;
  float local_ec;
  ImVec2 local_e8;
  ImVec2 local_e0;
  ImVec2 local_d8;
  ImRect local_d0;
  ImGuiWindow *local_c0;
  byte local_b4;
  byte local_b3;
  byte local_b2;
  byte local_b1;
  ImVec2 local_b0;
  ImVec2 *in_stack_ffffffffffffff58;
  ImGuiSelectableFlags in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  float in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  float fVar14;
  ImVec2 local_84;
  ImVec2 local_7c;
  float local_74;
  ImVec2 local_70;
  float in_stack_ffffffffffffff9c;
  ImVec2 IVar15;
  ImVec2 pos_00;
  bool local_45;
  float local_44;
  bool local_35;
  ImGuiID local_34;
  ImGuiStyle *local_30;
  ImGuiContext *local_28;
  ImGuiWindow *local_20;
  byte local_11;
  bool local_1;
  
  local_11 = in_SIL & 1;
  local_20 = GetCurrentWindow();
  if ((local_20->SkipItems & 1U) == 0) {
    local_28 = GImGui;
    local_30 = &GImGui->Style;
    local_34 = ImGuiWindow::GetID((ImGuiWindow *)
                                  CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                  in_stack_fffffffffffffeb8,
                                  (char *)CONCAT44(in_stack_fffffffffffffeb4,
                                                   in_stack_fffffffffffffeb0));
    local_35 = IsPopupOpen((ImGuiID)in_stack_fffffffffffffea4);
    bVar2 = ImVector<unsigned_int>::contains(&local_28->MenusIdSubmittedThisFrame,&local_34);
    if (bVar2) {
      if (local_35) {
        local_35 = BeginPopupEx(in_stack_fffffffffffffed0,
                                (ImGuiWindowFlags)((ulong)in_stack_fffffffffffffec8 >> 0x20));
      }
      else {
        ImGuiNextWindowData::ClearFlags(&local_28->NextWindowData);
      }
      local_1 = local_35;
    }
    else {
      ImVector<unsigned_int>::push_back
                ((ImVector<unsigned_int> *)
                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 (uint *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      IVar10 = CalcTextSize((char *)in_stack_fffffffffffffec8,
                            (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                            SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0),
                            SUB84(in_stack_fffffffffffffeb8,0));
      bVar2 = false;
      if (((local_20->Flags & 0x4000000U) == 0) &&
         (bVar2 = false, (local_28->BeginPopupStack).Size < (local_28->OpenPopupStack).Size)) {
        pIVar4 = ImVector<ImGuiPopupData>::operator[]
                           ((ImVector<ImGuiPopupData> *)
                            CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                            in_stack_fffffffffffffe9c);
        IVar1 = pIVar4->OpenParentId;
        puVar5 = ImVector<unsigned_int>::back
                           ((ImVector<unsigned_int> *)
                            CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
        bVar2 = IVar1 == *puVar5;
      }
      pos_00 = (ImVec2)local_28->NavWindow;
      if (bVar2) {
        local_28->NavWindow = local_20;
      }
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa8);
      IVar15 = (local_20->DC).CursorPos;
      if ((local_20->DC).LayoutType == 0) {
        fVar9 = (local_30->ItemSpacing).x;
        fVar8 = (local_30->FramePadding).y;
        fVar7 = ImGuiWindow::MenuBarHeight
                          ((ImGuiWindow *)
                           CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff98,
                       (IVar15.x - 1.0) - (float)(int)(fVar9 * 0.5),(IVar15.y - fVar8) + fVar7);
        (local_20->DC).CursorPos.x =
             (float)(int)((local_30->ItemSpacing).x * 0.5) + (local_20->DC).CursorPos.x;
        ImVec2::ImVec2(&local_70,(local_30->ItemSpacing).x * 2.0,(local_30->ItemSpacing).y);
        PushStyleVar(in_stack_fffffffffffffed4,in_stack_fffffffffffffec8);
        flags_00 = (ImGuiWindowFlags)((ulong)in_stack_fffffffffffffec8 >> 0x20);
        local_44 = IVar10.x;
        local_74 = local_44;
        ImVec2::ImVec2(&local_7c,local_44,0.0);
        local_45 = Selectable((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                              (bool)in_stack_ffffffffffffff67,in_stack_ffffffffffffff60,
                              in_stack_ffffffffffffff58);
        PopStyleVar(in_stack_fffffffffffffeb4);
        (local_20->DC).CursorPos.x =
             (float)(int)((local_30->ItemSpacing).x * -0.5) + (local_20->DC).CursorPos.x;
      }
      else {
        ImVec2::ImVec2(&local_84,IVar15.x,IVar15.y - (local_30->WindowPadding).y);
        fVar7 = 0.0;
        fVar9 = ImGuiMenuColumns::DeclColumns
                          ((ImGuiMenuColumns *)
                           CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                           (float)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                           SUB84(in_stack_fffffffffffffea8,0),in_stack_fffffffffffffea4);
        IVar10 = GetContentRegionAvail();
        fVar14 = IVar10.x;
        fVar8 = ImMax<float>(fVar7,fVar14 - fVar9);
        in_stack_fffffffffffffeb4 = (uint)local_35;
        this = (ImVec2 *)&stack0xffffffffffffff64;
        ImVec2::ImVec2(this,fVar9,fVar7);
        flags_00 = (ImGuiWindowFlags)((ulong)this >> 0x20);
        local_45 = Selectable((char *)CONCAT44(fVar14,in_stack_ffffffffffffff68),
                              (bool)in_stack_ffffffffffffff67,in_stack_ffffffffffffff60,
                              in_stack_ffffffffffffff58);
        GetColorU32(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0);
        ImVec2::ImVec2(&local_b0,
                       local_28->FontSize * 0.3 + (local_20->DC).MenuColumns.Pos[2] + fVar8,fVar7);
        operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                  (ImVec2 *)0x21adb3);
        RenderArrow((ImDrawList *)local_84,pos_00,(ImU32)IVar15.y,(ImGuiDir)IVar15.x,
                    in_stack_ffffffffffffff9c);
      }
      uVar13 = (uint)in_stack_fffffffffffffeb0 & 0xffffff;
      if ((local_11 & 1) != 0) {
        bVar3 = ItemHoverable(in_stack_fffffffffffffea8,(ImGuiID)in_stack_fffffffffffffea4);
        uVar13 = CONCAT13(bVar3,(int3)uVar13);
      }
      cond = (ImGuiCond)((ulong)in_stack_fffffffffffffea8 >> 0x20);
      local_b1 = (byte)(uVar13 >> 0x18);
      if (bVar2) {
        local_28->NavWindow = (ImGuiWindow *)pos_00;
      }
      local_b2 = 0;
      local_b3 = 0;
      if ((local_20->DC).LayoutType == 1) {
        local_b4 = 0;
        if (((local_28->BeginPopupStack).Size < (local_28->OpenPopupStack).Size) &&
           (pIVar4 = ImVector<ImGuiPopupData>::operator[]
                               ((ImVector<ImGuiPopupData> *)
                                CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                                in_stack_fffffffffffffe9c), pIVar4->SourceWindow == local_20)) {
          pIVar4 = ImVector<ImGuiPopupData>::operator[]
                             ((ImVector<ImGuiPopupData> *)
                              CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                              in_stack_fffffffffffffe9c);
          pIVar12 = pIVar4->Window;
        }
        else {
          pIVar12 = (ImGuiWindow *)0x0;
        }
        local_c0 = pIVar12;
        if (((local_28->HoveredWindow == local_20) && (pIVar12 != (ImGuiWindow *)0x0)) &&
           ((local_20->Flags & 0x400U) == 0)) {
          IVar11 = ImGuiWindow::Rect((ImGuiWindow *)0x21af54);
          local_d0.Min = IVar11.Min;
          local_d0.Max = IVar11.Max;
          local_d8 = ::operator-((ImVec2 *)
                                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                                 (ImVec2 *)0x21af84);
          if ((local_c0->Pos).x <= (local_20->Pos).x) {
            local_e0 = ImRect::GetTR((ImRect *)
                                     CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
          }
          else {
            local_e0 = ImRect::GetTL(&local_d0);
          }
          if ((local_c0->Pos).x <= (local_20->Pos).x) {
            local_e8 = ImRect::GetBR(&local_d0);
          }
          else {
            local_e8 = ImRect::GetBL((ImRect *)
                                     CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
          }
          local_ec = ImClamp<float>(ABS(local_d8.x - local_e0.x) * 0.3,5.0,30.0);
          uVar6 = -(uint)((local_20->Pos).x < (local_c0->Pos).x);
          local_d8.x = (float)(~uVar6 & 0x3f000000 | uVar6 & 0xbf000000) + local_d8.x;
          in_stack_fffffffffffffea0 = local_d8.y;
          fVar9 = ImMax<float>((local_e0.y - local_ec) - local_d8.y,-100.0);
          local_e0.y = in_stack_fffffffffffffea0 + fVar9;
          in_stack_fffffffffffffea4 = local_d8.y;
          fVar9 = ImMin<float>((local_e8.y + local_ec) - local_d8.y,100.0);
          local_e8.y = in_stack_fffffffffffffea4 + fVar9;
          local_b4 = ImTriangleContainsPoint(&local_d8,&local_e0,&local_e8,&(local_28->IO).MousePos)
          ;
        }
        cond = (ImGuiCond)((ulong)pIVar12 >> 0x20);
        if ((((local_35) && ((local_b1 & 1) == 0)) &&
            ((local_28->HoveredWindow == local_20 &&
             ((local_28->HoveredIdPreviousFrame != 0 &&
              (local_28->HoveredIdPreviousFrame != local_34)))))) && ((local_b4 & 1) == 0)) {
          local_b3 = 1;
        }
        if (((local_35) || ((local_b1 & 1) == 0)) || (local_45 == false)) {
          if (((!local_35) && ((local_b1 & 1) != 0)) && ((local_b4 & 1) == 0)) {
            local_b2 = 1;
          }
        }
        else {
          local_b2 = 1;
        }
        if (local_28->NavActivateId == local_34) {
          local_b2 = (local_35 ^ 0xffU) & 1;
          local_b3 = local_35;
        }
        if (((local_28->NavId == local_34) && ((local_28->NavMoveRequest & 1U) != 0)) &&
           (local_28->NavMoveDir == 1)) {
          local_b2 = 1;
          NavMoveRequestCancel();
        }
      }
      else if (((local_35) && (local_45 != false)) && (bVar2)) {
        local_b3 = 1;
        local_35 = false;
        local_b2 = 0;
      }
      else if ((local_45 != false) || (((local_b1 != 0 && (bVar2)) && (!local_35)))) {
        local_b2 = 1;
      }
      else if (((local_28->NavId == local_34) && ((local_28->NavMoveRequest & 1U) != 0)) &&
              (local_28->NavMoveDir == 3)) {
        local_b2 = 1;
        NavMoveRequestCancel();
      }
      if ((local_11 & 1) == 0) {
        local_b3 = 1;
      }
      if (((local_b3 & 1) != 0) && (bVar2 = IsPopupOpen((ImGuiID)in_stack_fffffffffffffea4), bVar2))
      {
        ClosePopupToLevel(in_stack_fffffffffffffeb4,SUB41(uVar13 >> 0x18,0));
      }
      if (((local_35 == false) && ((local_b2 & 1) != 0)) &&
         ((local_28->BeginPopupStack).Size < (local_28->OpenPopupStack).Size)) {
        OpenPopup((char *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
        local_1 = false;
      }
      else {
        bVar2 = local_35 != false;
        bVar3 = (local_b2 & 1) != 0;
        local_35 = bVar2 || bVar3;
        if ((local_b2 & 1) != 0) {
          OpenPopup((char *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
        }
        if (bVar2 || bVar3) {
          ImVec2::ImVec2(&local_f4,0.0,0.0);
          SetNextWindowPos((ImVec2 *)CONCAT44(in_stack_fffffffffffffeb4,uVar13),cond,
                           (ImVec2 *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
          local_35 = BeginPopupEx(in_stack_fffffffffffffed0,flags_00);
        }
        else {
          ImGuiNextWindowData::ClearFlags(&local_28->NextWindowData);
        }
        local_1 = local_35;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::BeginMenu(const char* label, bool enabled)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    bool menu_is_open = IsPopupOpen(id);

    // Sub-menus are ChildWindow so that mouse can be hovering across them (otherwise top-most popup menu would steal focus and not allow hovering on parent menu)
    ImGuiWindowFlags flags = ImGuiWindowFlags_ChildMenu | ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoNavFocus;
    if (window->Flags & (ImGuiWindowFlags_Popup | ImGuiWindowFlags_ChildMenu))
        flags |= ImGuiWindowFlags_ChildWindow;

    // If a menu with same the ID was already submitted, we will append to it, matching the behavior of Begin().
    // We are relying on a O(N) search - so O(N log N) over the frame - which seems like the most efficient for the expected small amount of BeginMenu() calls per frame.
    // If somehow this is ever becoming a problem we can switch to use e.g. a ImGuiStorager mapping key to last frame used.
    if (g.MenusIdSubmittedThisFrame.contains(id))
    {
        if (menu_is_open)
            menu_is_open = BeginPopupEx(id, flags); // menu_is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
        else
            g.NextWindowData.ClearFlags();          // we behave like Begin() and need to consume those values
        return menu_is_open;
    }

    // Tag menu as used. Next time BeginMenu() with same ID is called it will append to existing menu
    g.MenusIdSubmittedThisFrame.push_back(id);

    ImVec2 label_size = CalcTextSize(label, NULL, true);
    bool pressed;
    bool menuset_is_open = !(window->Flags & ImGuiWindowFlags_Popup) && (g.OpenPopupStack.Size > g.BeginPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].OpenParentId == window->IDStack.back());
    ImGuiWindow* backed_nav_window = g.NavWindow;
    if (menuset_is_open)
        g.NavWindow = window;  // Odd hack to allow hovering across menus of a same menu-set (otherwise we wouldn't be able to hover parent)

    // The reference position stored in popup_pos will be used by Begin() to find a suitable position for the child menu,
    // However the final position is going to be different! It is chosen by FindBestWindowPosForPopup().
    // e.g. Menus tend to overlap each other horizontally to amplify relative Z-ordering.
    ImVec2 popup_pos, pos = window->DC.CursorPos;
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
    {
        // Menu inside an horizontal menu bar
        // Selectable extend their highlight by half ItemSpacing in each direction.
        // For ChildMenu, the popup position will be overwritten by the call to FindBestWindowPosForPopup() in Begin()
        popup_pos = ImVec2(pos.x - 1.0f - IM_FLOOR(style.ItemSpacing.x * 0.5f), pos.y - style.FramePadding.y + window->MenuBarHeight());
        window->DC.CursorPos.x += IM_FLOOR(style.ItemSpacing.x * 0.5f);
        PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(style.ItemSpacing.x * 2.0f, style.ItemSpacing.y));
        float w = label_size.x;
        pressed = Selectable(label, menu_is_open, ImGuiSelectableFlags_NoHoldingActiveID | ImGuiSelectableFlags_SelectOnClick | ImGuiSelectableFlags_DontClosePopups | (!enabled ? ImGuiSelectableFlags_Disabled : 0), ImVec2(w, 0.0f));
        PopStyleVar();
        window->DC.CursorPos.x += IM_FLOOR(style.ItemSpacing.x * (-1.0f + 0.5f)); // -1 spacing to compensate the spacing added when Selectable() did a SameLine(). It would also work to call SameLine() ourselves after the PopStyleVar().
    }
    else
    {
        // Menu inside a menu
        // (In a typical menu window where all items are BeginMenu() or MenuItem() calls, extra_w will always be 0.0f.
        //  Only when they are other items sticking out we're going to add spacing, yet only register minimum width into the layout system.
        popup_pos = ImVec2(pos.x, pos.y - style.WindowPadding.y);
        float min_w = window->DC.MenuColumns.DeclColumns(label_size.x, 0.0f, IM_FLOOR(g.FontSize * 1.20f)); // Feedback to next frame
        float extra_w = ImMax(0.0f, GetContentRegionAvail().x - min_w);
        pressed = Selectable(label, menu_is_open, ImGuiSelectableFlags_NoHoldingActiveID | ImGuiSelectableFlags_SelectOnClick | ImGuiSelectableFlags_DontClosePopups | ImGuiSelectableFlags_SpanAvailWidth | (!enabled ? ImGuiSelectableFlags_Disabled : 0), ImVec2(min_w, 0.0f));
        ImU32 text_col = GetColorU32(enabled ? ImGuiCol_Text : ImGuiCol_TextDisabled);
        RenderArrow(window->DrawList, pos + ImVec2(window->DC.MenuColumns.Pos[2] + extra_w + g.FontSize * 0.30f, 0.0f), text_col, ImGuiDir_Right);
    }

    const bool hovered = enabled && ItemHoverable(window->DC.LastItemRect, id);
    if (menuset_is_open)
        g.NavWindow = backed_nav_window;

    bool want_open = false;
    bool want_close = false;
    if (window->DC.LayoutType == ImGuiLayoutType_Vertical) // (window->Flags & (ImGuiWindowFlags_Popup|ImGuiWindowFlags_ChildMenu))
    {
        // Close menu when not hovering it anymore unless we are moving roughly in the direction of the menu
        // Implement http://bjk5.com/post/44698559168/breaking-down-amazons-mega-dropdown to avoid using timers, so menus feels more reactive.
        bool moving_toward_other_child_menu = false;

        ImGuiWindow* child_menu_window = (g.BeginPopupStack.Size < g.OpenPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].SourceWindow == window) ? g.OpenPopupStack[g.BeginPopupStack.Size].Window : NULL;
        if (g.HoveredWindow == window && child_menu_window != NULL && !(window->Flags & ImGuiWindowFlags_MenuBar))
        {
            // FIXME-DPI: Values should be derived from a master "scale" factor.
            ImRect next_window_rect = child_menu_window->Rect();
            ImVec2 ta = g.IO.MousePos - g.IO.MouseDelta;
            ImVec2 tb = (window->Pos.x < child_menu_window->Pos.x) ? next_window_rect.GetTL() : next_window_rect.GetTR();
            ImVec2 tc = (window->Pos.x < child_menu_window->Pos.x) ? next_window_rect.GetBL() : next_window_rect.GetBR();
            float extra = ImClamp(ImFabs(ta.x - tb.x) * 0.30f, 5.0f, 30.0f);    // add a bit of extra slack.
            ta.x += (window->Pos.x < child_menu_window->Pos.x) ? -0.5f : +0.5f; // to avoid numerical issues
            tb.y = ta.y + ImMax((tb.y - extra) - ta.y, -100.0f);                // triangle is maximum 200 high to limit the slope and the bias toward large sub-menus // FIXME: Multiply by fb_scale?
            tc.y = ta.y + ImMin((tc.y + extra) - ta.y, +100.0f);
            moving_toward_other_child_menu = ImTriangleContainsPoint(ta, tb, tc, g.IO.MousePos);
            //GetForegroundDrawList()->AddTriangleFilled(ta, tb, tc, moving_within_opened_triangle ? IM_COL32(0,128,0,128) : IM_COL32(128,0,0,128)); // [DEBUG]
        }
        if (menu_is_open && !hovered && g.HoveredWindow == window && g.HoveredIdPreviousFrame != 0 && g.HoveredIdPreviousFrame != id && !moving_toward_other_child_menu)
            want_close = true;

        if (!menu_is_open && hovered && pressed) // Click to open
            want_open = true;
        else if (!menu_is_open && hovered && !moving_toward_other_child_menu) // Hover to open
            want_open = true;

        if (g.NavActivateId == id)
        {
            want_close = menu_is_open;
            want_open = !menu_is_open;
        }
        if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Right) // Nav-Right to open
        {
            want_open = true;
            NavMoveRequestCancel();
        }
    }
    else
    {
        // Menu bar
        if (menu_is_open && pressed && menuset_is_open) // Click an open menu again to close it
        {
            want_close = true;
            want_open = menu_is_open = false;
        }
        else if (pressed || (hovered && menuset_is_open && !menu_is_open)) // First click to open, then hover to open others
        {
            want_open = true;
        }
        else if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Down) // Nav-Down to open
        {
            want_open = true;
            NavMoveRequestCancel();
        }
    }

    if (!enabled) // explicitly close if an open menu becomes disabled, facilitate users code a lot in pattern such as 'if (BeginMenu("options", has_object)) { ..use object.. }'
        want_close = true;
    if (want_close && IsPopupOpen(id))
        ClosePopupToLevel(g.BeginPopupStack.Size, true);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags | ImGuiItemStatusFlags_Openable | (menu_is_open ? ImGuiItemStatusFlags_Opened : 0));

    if (!menu_is_open && want_open && g.OpenPopupStack.Size > g.BeginPopupStack.Size)
    {
        // Don't recycle same menu level in the same frame, first close the other menu and yield for a frame.
        OpenPopup(label);
        return false;
    }

    menu_is_open |= want_open;
    if (want_open)
        OpenPopup(label);

    if (menu_is_open)
    {
        SetNextWindowPos(popup_pos, ImGuiCond_Always);
        menu_is_open = BeginPopupEx(id, flags); // menu_is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    }
    else
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
    }

    return menu_is_open;
}